

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

void __thiscall
flatbuffers::ResizeContext::ResizeContext
          (ResizeContext *this,Schema *schema,uoffset_t start,int delta,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *flatbuf,Object *root_table)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  Table *second;
  uchar *puVar2;
  size_type_conflict sVar3;
  uchar *offsetloc;
  Object *local_f8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_b0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_a8;
  const_iterator local_a0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_98;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_90;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_88;
  const_iterator local_80;
  value_type_conflict1 local_69;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_68;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  const_iterator local_58;
  Table *local_50;
  Table *root;
  int mask;
  allocator<unsigned_char> local_32;
  value_type_conflict1 local_31;
  Object *local_30;
  Object *root_table_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *flatbuf_local;
  int delta_local;
  uoffset_t start_local;
  Schema *schema_local;
  ResizeContext *this_local;
  
  this->schema_ = schema;
  local_30 = root_table;
  root_table_local = (Object *)flatbuf;
  flatbuf_local._0_4_ = delta;
  flatbuf_local._4_4_ = start;
  _delta_local = schema;
  schema_local = (Schema *)this;
  puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(flatbuf);
  this->startptr_ = puVar2 + flatbuf_local._4_4_;
  this->delta_ = (int)flatbuf_local;
  this->buf_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)root_table_local;
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)root_table_local);
  local_31 = '\0';
  std::allocator<unsigned_char>::allocator(&local_32);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->dag_check_,sVar3 >> 2,&local_31,&local_32);
  std::allocator<unsigned_char>::~allocator(&local_32);
  root._0_4_ = 7;
  this->delta_ = this->delta_ + 7U & 0xfffffff8;
  if (this->delta_ != 0) {
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(this->buf_);
    local_50 = GetAnyRoot(puVar2);
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(this->buf_);
    second = local_50;
    offsetloc = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(this->buf_);
    Straddle<unsigned_int,1>(this,puVar2,second,offsetloc);
    if (local_30 == (Object *)0x0) {
      local_f8 = reflection::Schema::root_table(_delta_local);
    }
    else {
      local_f8 = local_30;
    }
    ResizeTable(this,local_f8,local_50);
    if (this->delta_ < 1) {
      pvVar1 = this->buf_;
      local_98._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pvVar1);
      local_90 = __gnu_cxx::
                 __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator+(&local_98,(ulong)flatbuf_local._4_4_);
      local_88 = __gnu_cxx::
                 __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator+(&local_90,(long)this->delta_);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_80,&local_88);
      local_b0._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(this->buf_);
      local_a8 = __gnu_cxx::
                 __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator+(&local_b0,(ulong)flatbuf_local._4_4_);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_a0,&local_a8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase(pvVar1,local_80,local_a0);
    }
    else {
      pvVar1 = this->buf_;
      local_68._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pvVar1);
      local_60 = __gnu_cxx::
                 __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator+(&local_68,(ulong)flatbuf_local._4_4_);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_58,&local_60);
      local_69 = '\0';
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
                (pvVar1,local_58,(long)this->delta_,&local_69);
    }
  }
  return;
}

Assistant:

ResizeContext(const reflection::Schema &schema, uoffset_t start, int delta,
                std::vector<uint8_t> *flatbuf,
                const reflection::Object *root_table = nullptr)
      : schema_(schema),
        startptr_(flatbuf->data() + start),
        delta_(delta),
        buf_(*flatbuf),
        dag_check_(flatbuf->size() / sizeof(uoffset_t), false) {
    auto mask = static_cast<int>(sizeof(largest_scalar_t) - 1);
    delta_ = (delta_ + mask) & ~mask;
    if (!delta_) return;  // We can't shrink by less than largest_scalar_t.
    // Now change all the offsets by delta_.
    auto root = GetAnyRoot(buf_.data());
    Straddle<uoffset_t, 1>(buf_.data(), root, buf_.data());
    ResizeTable(root_table ? *root_table : *schema.root_table(), root);
    // We can now add or remove bytes at start.
    if (delta_ > 0)
      buf_.insert(buf_.begin() + start, delta_, 0);
    else
      buf_.erase(buf_.begin() + start + delta_, buf_.begin() + start);
  }